

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

int jsons_print_model(lyout *out,lys_module *module,char *target_schema_path)

{
  int local_4c;
  int rc;
  char *target_schema_path_local;
  lys_module *module_local;
  lyout *out_local;
  
  local_4c = 0;
  if (target_schema_path == (char *)0x0) {
    if ((*(ushort *)&module->field_0x40 & 1) == 0) {
      jsons_print_module(out,module);
    }
    else {
      jsons_print_submodule(out,(lys_submodule *)module);
    }
  }
  else {
    ly_print(out,"{");
    local_4c = lys_print_target(out,module,target_schema_path,jsons_print_typedef,
                                jsons_print_identity,jsons_print_feature,jsons_print_type,
                                jsons_print_grouping,jsons_print_container,jsons_print_choice,
                                jsons_print_leaf,jsons_print_leaflist,jsons_print_list,
                                jsons_print_anydata,jsons_print_case,jsons_print_notif,
                                jsons_print_rpc,jsons_print_action,jsons_print_input,
                                jsons_print_output);
    ly_print(out,"}");
  }
  ly_print_flush(out);
  return local_4c;
}

Assistant:

int
jsons_print_model(struct lyout *out, const struct lys_module *module, const char *target_schema_path)
{
    int rc = EXIT_SUCCESS;

    if (!target_schema_path) {
        if (module->type == 0) {
            jsons_print_module(out, module);
        } else {
            jsons_print_submodule(out, (struct lys_submodule *)module);
        }
    } else {
        ly_print(out, "{");
        rc = lys_print_target(out, module, target_schema_path,
                              jsons_print_typedef,
                              jsons_print_identity,
                              jsons_print_feature,
                              jsons_print_type,
                              jsons_print_grouping,
                              jsons_print_container,
                              jsons_print_choice,
                              jsons_print_leaf,
                              jsons_print_leaflist,
                              jsons_print_list,
                              jsons_print_anydata,
                              jsons_print_case,
                              jsons_print_notif,
                              jsons_print_rpc,
                              jsons_print_action,
                              jsons_print_input,
                              jsons_print_output);
        ly_print(out, "}");
    }
    ly_print_flush(out);

    return rc;
}